

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArithmeticSubtermGeneralization.cpp
# Opt level: O0

Result Inferences::
       generalizeBottomUp<Inferences::EvaluateMonom<Inferences::VariableMultiplicationGeneralizationImpl::Generalize>>
                 (Clause *cl,
                 EvaluateMonom<Inferences::VariableMultiplicationGeneralizationImpl::Generalize>
                 eval)

{
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>
  i;
  anon_class_24_3_4b77cd38_for__func f;
  Clause *pCVar1;
  undefined8 extraout_RDX;
  Clause *in_RDI;
  Result RVar2;
  bool redundant;
  Inference inf;
  Stack<Kernel::Literal_*> stack;
  bool allLessEq;
  bool oneLess;
  SimplifyingInference1 *si;
  Inference *this;
  Clause *in_stack_fffffffffffffe90;
  Clause **ppCVar3;
  undefined8 in_stack_fffffffffffffeb0;
  undefined8 in_stack_fffffffffffffeb8;
  undefined8 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  Stack<Kernel::Literal_*> *in_stack_fffffffffffffef0;
  SimplifyingInference1 local_108;
  IterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>_>
  *in_stack_ffffffffffffff10;
  void *in_stack_ffffffffffffff20;
  void *in_stack_ffffffffffffff28;
  bool *in_stack_ffffffffffffff30;
  undefined1 local_29 [9];
  SimplifyingInference1 local_20;
  Clause *local_10;
  byte local_8;
  
  local_29[0] = 0;
  local_29._1_8_ = in_RDI;
  Kernel::Clause::iterLits(in_stack_fffffffffffffe90);
  i._iter._inner._next = (int)in_stack_fffffffffffffeb8;
  i._iter._inner._from = SUB84(in_stack_fffffffffffffeb8,4);
  i._iter._func.a = (Clause *)in_stack_fffffffffffffeb0;
  i._iter._inner._to = (int)in_stack_fffffffffffffec0;
  i._iter._20_4_ = SUB84(in_stack_fffffffffffffec0,4);
  Lib::
  iterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,Lib::arrayIter<Kernel::Clause,unsigned_int>(Kernel::Clause&,unsigned_int)::_lambda(auto:1)_1_,Kernel::Literal*&>>>
            (i);
  si = &local_20;
  this = (Inference *)local_29;
  f.oneLess = (bool *)in_stack_ffffffffffffff28;
  f.eval = (EvaluateMonom<Inferences::NumeralMultiplicationGeneralizationImpl::Generalize> *)
           in_stack_ffffffffffffff20;
  f.allLessEq = in_stack_ffffffffffffff30;
  Lib::
  IterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,Lib::arrayIter<Kernel::Clause,unsigned_int>(Kernel::Clause&,unsigned_int)::{lambda(auto:1)#1},Kernel::Literal*&>>>
  ::
  map<Inferences::generalizeBottomUp<Inferences::EvaluateMonom<Inferences::VariableMultiplicationGeneralizationImpl::Generalize>>(Kernel::Clause*,Inferences::EvaluateMonom<Inferences::VariableMultiplicationGeneralizationImpl::Generalize>)::_lambda(Kernel::Literal*)_1_>
            (in_stack_ffffffffffffff10,f);
  Lib::
  IterTraits<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:90:10),_Kernel::Literal_*>_>
  ::collect<Lib::Stack>
            ((IterTraits<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:90:10),_Kernel::Literal_*>_>
              *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  Kernel::SimplifyingInference1::SimplifyingInference1
            (&local_108,ARITHMETIC_SUBTERM_GENERALIZATION,(Clause *)local_29._1_8_);
  Kernel::Inference::Inference(this,si);
  local_8 = local_29[0] & 1;
  *(int *)(DAT_01333840 + 0x17c) = *(int *)(DAT_01333840 + 0x17c) + 1;
  if (local_8 == 0) {
    *(int *)(DAT_01333840 + 0x178) = *(int *)(DAT_01333840 + 0x178) + 1;
  }
  ppCVar3 = &local_10;
  pCVar1 = Kernel::Clause::fromStack
                     (in_stack_fffffffffffffef0,
                      (Inference *)
                      (CONCAT44(in_stack_fffffffffffffeec,
                                CONCAT13(local_29[0],(int3)in_stack_fffffffffffffee8)) &
                      0xffffffff01ffffff));
  *ppCVar3 = pCVar1;
  local_8 = local_8 & 1;
  Kernel::Inference::~Inference((Inference *)&stack0xfffffffffffffeb8);
  Kernel::Inference::~Inference((Inference *)&stack0xffffffffffffff08);
  Lib::Stack<Kernel::Literal_*>::~Stack((Stack<Kernel::Literal_*> *)this);
  RVar2._9_7_ = (undefined7)((ulong)extraout_RDX >> 8);
  RVar2.premiseRedundant = (bool)local_8;
  RVar2.simplified = local_10;
  return RVar2;
}

Assistant:

SimplifyingGeneratingInference1::Result generalizeBottomUp(Clause* cl, EvalFn eval) 
{
  /* apply the selectedGen generalization */
  DEBUG_CODE(bool anyChange = false);
  bool oneLess = false;
  bool allLessEq = true;

  auto stack = iterTraits(cl->iterLits())
    .map([&](Literal* lit) -> Literal* {
        unsigned j = 0;
        auto termArgs = termArgIter(lit)
          .map([&](TermList term) -> TermList { 
              auto norm = PolyNf::normalize(TypedTermList(term, SortHelper::getTermArgSort(lit, j++)));
              auto res = BottomUpEvaluation<typename EvalFn::Arg, typename EvalFn::Result>().function(eval).apply(norm);
              if (res != norm) {
                DEBUG_CODE(anyChange = true);
                DEBUG("generalized: ", norm, " -> ", res);
                return res.denormalize();
              } else {
                return term;
              }
          });
        auto args = concatIters(typeArgIter(lit), termArgs)
              .template collect<Stack>();

        auto generalizedLit = Literal::create(
            lit, 
            args.begin());

        if (eval.eval.doOrderingCheck) {

          auto ord = Ordering::tryGetGlobalOrdering();
          ASS(ord)
          auto cmp = ord->compare(generalizedLit, lit);
          switch(cmp) {
            case Ordering::LESS:
              oneLess = true;
              break;
            case Ordering::EQUAL:
              break;
            case Ordering::GREATER:
            case Ordering::INCOMPARABLE:
              allLessEq = false;
              DEBUG("ordering violation: ", cmp)
              DEBUG("original   : ", *lit)
              DEBUG("generalized: ", *generalizedLit)
              break;
          }
        }
        return generalizedLit;
    })
    .template collect<Stack>();

  ASS(anyChange)
  Inference inf(SimplifyingInference1(Kernel::InferenceRule::ARITHMETIC_SUBTERM_GENERALIZATION, cl));
  bool redundant = allLessEq && oneLess;
  env.statistics->asgCnt++;
  if (!redundant) {
    env.statistics->asgViolations++;
  }
  return SimplifyingGeneratingInference1::Result{
    .simplified = Clause::fromStack(stack, inf), 
    .premiseRedundant = redundant
  };
}